

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QWidget * __thiscall
QWidgetPrivate::childAtRecursiveHelper
          (QWidgetPrivate *this,QPointF *p,bool ignoreChildrenInDestructor)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  QWidget *pQVar4;
  QWidgetData *pQVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  char cVar10;
  QWidget *pQVar11;
  long lVar12;
  long in_FS_OFFSET;
  ulong uVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  QPointF local_78;
  undefined8 local_60;
  QPointF local_58;
  double local_48;
  double dStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)*(ulong *)&this->field_0x28 + -1 < 0) {
    pQVar11 = (QWidget *)0x0;
  }
  else {
    lVar12 = (*(ulong *)&this->field_0x28 & 0xffffffff) - 2;
    pQVar11 = (QWidget *)0x0;
    auVar23._8_4_ = 0xffffffff;
    auVar23._0_8_ = 0xffffffffffffffff;
    auVar23._12_4_ = 0xffffffff;
    do {
      iVar9 = (int)lVar12;
      pQVar4 = *(QWidget **)(*(long *)&this->field_0x20 + (ulong)(iVar9 + 1U & 0x7fffffff) * 8);
      if (((((pQVar4 != (QWidget *)0x0) &&
            ((*(byte *)(*(long *)&pQVar4->field_0x8 + 0x30) & 1) != 0)) &&
           (pQVar5 = pQVar4->data,
           ((pQVar5->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) &&
          (((pQVar5->widget_attributes & 0x10000) == 0 &&
           ((*(byte *)(*(long *)&pQVar4->field_0x8 + 0x242) & 8) == 0)))) &&
         ((!ignoreChildrenInDestructor || ((pQVar5->field_0x12 & 4) == 0)))) {
        uVar1 = (pQVar5->crect).x1;
        uVar3 = (pQVar5->crect).y1;
        local_78.xp = p->xp - (double)(int)uVar1;
        local_78.yp = p->yp - (double)(int)uVar3;
        lVar6 = *(long *)&pQVar4->field_0x8;
        lVar7 = *(long *)(lVar6 + 8);
        lVar8 = *(long *)(lVar7 + 0x20);
        uVar2 = *(undefined8 *)(lVar8 + 0x1c);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)(lVar8 + 0x14);
        auVar19 = auVar19 ^ auVar23;
        auVar20._0_4_ = auVar19._0_4_ + (int)uVar2;
        auVar20._4_4_ = auVar19._4_4_ + (int)((ulong)uVar2 >> 0x20);
        auVar20._8_4_ = auVar19._8_4_;
        auVar20._12_4_ = auVar19._12_4_;
        auVar16._0_4_ = -(uint)(auVar23._0_4_ < auVar20._0_4_);
        auVar16._4_4_ = -(uint)(auVar23._4_4_ < auVar20._4_4_);
        auVar16._8_4_ = -(uint)(auVar23._8_4_ < auVar20._8_4_);
        auVar16._12_4_ = -(uint)(auVar23._12_4_ < auVar20._12_4_);
        auVar16 = auVar16 ^ auVar23 | auVar20 & auVar16;
        local_58.xp = 0.0;
        local_58.yp = 0.0;
        auVar17._0_8_ = auVar16._0_8_;
        auVar17._8_4_ = auVar16._4_4_;
        auVar17._12_4_ = -(uint)(auVar16._4_4_ < 0);
        uVar13 = CONCAT44(-(uint)(auVar16._0_4_ < 0),auVar16._0_4_) - auVar23._0_8_;
        uVar18 = auVar17._8_8_ - auVar23._8_8_;
        local_48 = ((double)(uVar13 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                   (double)(uVar13 & 0xffffffff | 0x4330000000000000);
        dStack_40 = ((double)(uVar18 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                    (double)(uVar18 & 0xffffffff | 0x4330000000000000);
        cVar10 = QRectF::contains(&local_58);
        if (cVar10 != '\0') {
          lVar6 = *(long *)(lVar6 + 0x78);
          if (((lVar6 != 0) && ((*(byte *)(lVar6 + 0x7c) & 0x80) != 0)) &&
             ((*(byte *)(*(long *)(lVar7 + 8) + 0x244) & 0x80) == 0)) {
            dVar21 = (double)((ulong)local_78.xp & 0x8000000000000000 | 0x3fe0000000000000) +
                     local_78.xp;
            dVar22 = dVar21;
            if (dVar21 <= -2147483648.0) {
              dVar22 = -2147483648.0;
            }
            dVar14 = (double)((ulong)local_78.yp & 0x8000000000000000 | 0x3fe0000000000000) +
                     local_78.yp;
            dVar15 = dVar14;
            if (dVar14 <= -2147483648.0) {
              dVar15 = -2147483648.0;
            }
            local_60 = CONCAT44((int)(double)(-(ulong)(2147483647.0 < dVar14) & 0x41dfffffffc00000 |
                                             ~-(ulong)(2147483647.0 < dVar14) & (ulong)dVar15),
                                (int)(double)(-(ulong)(2147483647.0 < dVar21) & 0x41dfffffffc00000 |
                                             ~-(ulong)(2147483647.0 < dVar21) & (ulong)dVar22));
            cVar10 = QRegion::contains((QPoint *)(lVar6 + 0x40));
            if (cVar10 == '\0') goto LAB_0030c318;
          }
          pQVar11 = childAtRecursiveHelper
                              (*(QWidgetPrivate **)&pQVar4->field_0x8,&local_78,
                               ignoreChildrenInDestructor);
          if (pQVar11 == (QWidget *)0x0) {
            pQVar11 = pQVar4;
          }
          break;
        }
LAB_0030c318:
        auVar23._8_4_ = 0xffffffff;
        auVar23._0_8_ = 0xffffffffffffffff;
        auVar23._12_4_ = 0xffffffff;
      }
      lVar12 = lVar12 + -1;
    } while (-1 < iVar9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar11;
}

Assistant:

QWidget *QWidgetPrivate::childAtRecursiveHelper(const QPointF &p, bool ignoreChildrenInDestructor) const
{
    for (int i = children.size() - 1; i >= 0; --i) {
        QWidget *child = qobject_cast<QWidget *>(children.at(i));
        if (!child || child->isWindow() || child->isHidden() || child->testAttribute(Qt::WA_TransparentForMouseEvents)
            || (ignoreChildrenInDestructor && child->data->in_destructor)) {
            continue;
        }

        // Map the point 'p' from parent coordinates to child coordinates.
        QPointF childPoint = p;
        childPoint -= child->data->crect.topLeft();

        // Check if the point hits the child.
        if (!child->d_func()->pointInsideRectAndMask(childPoint))
            continue;

        // Do the same for the child's descendants.
        if (QWidget *w = child->d_func()->childAtRecursiveHelper(childPoint, ignoreChildrenInDestructor))
            return w;

        // We have found our target; namely the child at position 'p'.
        return child;
    }
    return nullptr;
}